

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SolverParameter::SolverParameter(SolverParameter *this,SolverParameter *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  NetParameter *pNVar4;
  NetState *this_01;
  SolverParameter *from_local;
  SolverParameter *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SolverParameter_00d4dcb0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  *(undefined8 *)(this->_has_bits_).has_bits_ = *(undefined8 *)(from->_has_bits_).has_bits_;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->test_net_,&from->test_net_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->test_iter_,&from->test_iter_);
  google::protobuf::RepeatedPtrField<caffe::NetParameter>::RepeatedPtrField
            (&this->test_net_param_,&from->test_net_param_);
  google::protobuf::RepeatedPtrField<caffe::NetState>::RepeatedPtrField
            (&this->test_state_,&from->test_state_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->stepvalue_,&from->stepvalue_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->train_net_,psVar2);
  bVar1 = has_train_net(from);
  if (bVar1) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->train_net_,psVar2,(from->train_net_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->lr_policy_,psVar2);
  bVar1 = has_lr_policy(from);
  if (bVar1) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->lr_policy_,psVar2,(from->lr_policy_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->snapshot_prefix_,psVar2);
  bVar1 = has_snapshot_prefix(from);
  if (bVar1) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->snapshot_prefix_,psVar2,(from->snapshot_prefix_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->net_,psVar2);
  bVar1 = has_net(from);
  if (bVar1) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->net_,psVar2,(from->net_).ptr_);
  }
  pbVar3 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)_default_regularization_type__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->regularization_type_,pbVar3);
  bVar1 = has_regularization_type(from);
  if (bVar1) {
    pbVar3 = google::protobuf::internal::
             ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)_default_regularization_type__abi_cxx11_);
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->regularization_type_,pbVar3,(from->regularization_type_).ptr_);
  }
  pbVar3 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)_default_type__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->type_,pbVar3);
  bVar1 = has_type(from);
  if (bVar1) {
    pbVar3 = google::protobuf::internal::
             ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)_default_type__abi_cxx11_);
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->type_,pbVar3,(from->type_).ptr_);
  }
  bVar1 = has_train_net_param(from);
  if (bVar1) {
    pNVar4 = (NetParameter *)operator_new(0xa0);
    NetParameter::NetParameter(pNVar4,from->train_net_param_);
    this->train_net_param_ = pNVar4;
  }
  else {
    this->train_net_param_ = (NetParameter *)0x0;
  }
  bVar1 = has_net_param(from);
  if (bVar1) {
    pNVar4 = (NetParameter *)operator_new(0xa0);
    NetParameter::NetParameter(pNVar4,from->net_param_);
    this->net_param_ = pNVar4;
  }
  else {
    this->net_param_ = (NetParameter *)0x0;
  }
  bVar1 = has_train_state(from);
  if (bVar1) {
    this_01 = (NetState *)operator_new(0x38);
    NetState::NetState(this_01,from->train_state_);
    this->train_state_ = this_01;
  }
  else {
    this->train_state_ = (NetState *)0x0;
  }
  memcpy(&this->test_interval_,&from->test_interval_,0x60);
  return;
}

Assistant:

SolverParameter::SolverParameter(const SolverParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      test_net_(from.test_net_),
      test_iter_(from.test_iter_),
      test_net_param_(from.test_net_param_),
      test_state_(from.test_state_),
      stepvalue_(from.stepvalue_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  train_net_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_train_net()) {
    train_net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.train_net_);
  }
  lr_policy_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_lr_policy()) {
    lr_policy_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.lr_policy_);
  }
  snapshot_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_snapshot_prefix()) {
    snapshot_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.snapshot_prefix_);
  }
  net_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_net()) {
    net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.net_);
  }
  regularization_type_.UnsafeSetDefault(&SolverParameter::_default_regularization_type_.get());
  if (from.has_regularization_type()) {
    regularization_type_.AssignWithDefault(&SolverParameter::_default_regularization_type_.get(), from.regularization_type_);
  }
  type_.UnsafeSetDefault(&SolverParameter::_default_type_.get());
  if (from.has_type()) {
    type_.AssignWithDefault(&SolverParameter::_default_type_.get(), from.type_);
  }
  if (from.has_train_net_param()) {
    train_net_param_ = new ::caffe::NetParameter(*from.train_net_param_);
  } else {
    train_net_param_ = NULL;
  }
  if (from.has_net_param()) {
    net_param_ = new ::caffe::NetParameter(*from.net_param_);
  } else {
    net_param_ = NULL;
  }
  if (from.has_train_state()) {
    train_state_ = new ::caffe::NetState(*from.train_state_);
  } else {
    train_state_ = NULL;
  }
  ::memcpy(&test_interval_, &from.test_interval_,
    reinterpret_cast<char*>(&rms_decay_) -
    reinterpret_cast<char*>(&test_interval_) + sizeof(rms_decay_));
  // @@protoc_insertion_point(copy_constructor:caffe.SolverParameter)
}